

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
 __thiscall
Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
          (Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *this)

{
  __pthread_internal_list **this_00;
  ulong uVar1;
  long *plVar2;
  size_type sVar3;
  runtime_error *this_01;
  mutex_type *in_RSI;
  int *in_R9;
  unique_lock<std::mutex> lock;
  char local_54 [4];
  string local_50;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,in_RSI);
  if (in_RSI[2].super___mutex_base._M_mutex.__size[0x18] != '\x01') {
    this_00 = &in_RSI[2].super___mutex_base._M_mutex.__data.__list.__next;
    sVar3 = std::
            deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
            ::size((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                    *)this_00);
    if (sVar3 == 0) {
      uVar1 = *(ulong *)((long)&in_RSI[2].super___mutex_base._M_mutex + 8);
      if (uVar1 < *(ulong *)((long)&in_RSI[2].super___mutex_base._M_mutex + 0x10)) {
        *(ulong *)((long)&in_RSI[2].super___mutex_base._M_mutex + 8) = uVar1 + 1;
        std::make_unique<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>();
        std::
        deque<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>,std::allocator<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>>
        ::
        emplace_back<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>
                  ((deque<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>,std::allocator<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>>
                    *)this_00,
                   (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                    *)&local_50);
        std::
        unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                       *)&local_50);
      }
      else {
        while( true ) {
          sVar3 = std::
                  deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                  ::size((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                          *)this_00);
          if (sVar3 != 0) break;
          std::condition_variable::wait((unique_lock *)(in_RSI + 1));
        }
      }
    }
    plVar2 = *(long **)((long)&in_RSI[3].super___mutex_base._M_mutex + 8);
    (this->m_).super___mutex_base._M_mutex.__align = *plVar2;
    *plVar2 = 0;
    std::
    deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
    ::pop_front((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                 *)this_00);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
              )this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_54[0] = '&';
  local_54[1] = '\0';
  local_54[2] = '\0';
  local_54[3] = '\0';
  util::str<char[32],char[94],char[2],int>
            (&local_50,(util *)"Assertion `!closed_` failed at ",
             (char (*) [32])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesrecv/queue.h"
             ,(char (*) [94])0x136ba2,(char (*) [2])local_54,in_R9);
  std::runtime_error::runtime_error(this_01,(string *)&local_50);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<T> popForWrite() {
    std::unique_lock<std::mutex> lock(m_);
    ASSERT(!closed_);

    // Ensure there is an item to return
    if (write_.size() == 0) {
      if (elements_ < capacity_) {
        elements_++;
        write_.push_back(std::make_unique<T>());
      } else {
        // Wait until pushRead makes an item available
        while (write_.size() == 0) {
          cv_.wait(lock);
        }
      }
    }

    auto v = std::move(write_.front());
    write_.pop_front();
    return v;
  }